

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

Tag * __thiscall
Mustache::Renderer::findEndTag
          (Tag *__return_storage_ptr__,Renderer *this,QString *content,Tag *startTag,int endPos)

{
  bool bVar1;
  int pos;
  int iVar2;
  Tag nextTag;
  QArrayDataPointer<char16_t> local_48;
  
  pos = startTag->end;
  iVar2 = 1;
  do {
    findTag(&nextTag,this,content,pos,endPos);
    if (nextTag.type == Null) {
      Tag::Tag(__return_storage_ptr__,&nextTag);
LAB_00111e31:
      bVar1 = false;
    }
    else {
      if ((nextTag.type & ~Value) == SectionStart) {
        iVar2 = iVar2 + 1;
      }
      else if ((nextTag.type == SectionEnd) && (iVar2 = iVar2 + -1, iVar2 == 0)) {
        bVar1 = operator!=(&nextTag.key,&startTag->key);
        if (bVar1) {
          QString::QString((QString *)&local_48,"Tag start/end key mismatch");
          setError(this,(QString *)&local_48,nextTag.start);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
          __return_storage_ptr__->type = Null;
          __return_storage_ptr__->escapeMode = Escape;
          __return_storage_ptr__->indentation = 0;
          (__return_storage_ptr__->key).d.size = 0;
          __return_storage_ptr__->start = 0;
          __return_storage_ptr__->end = 0;
          (__return_storage_ptr__->key).d.d = (Data *)0x0;
          (__return_storage_ptr__->key).d.ptr = (char16_t *)0x0;
        }
        else {
          Tag::Tag(__return_storage_ptr__,&nextTag);
        }
        iVar2 = 0;
        goto LAB_00111e31;
      }
      bVar1 = true;
      pos = nextTag.end;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&nextTag.key.d);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Tag Renderer::findEndTag(const QString& content, const Tag& startTag, int endPos)
{
	int tagDepth = 1;
	int pos = startTag.end;

	while (true) {
		Tag nextTag = findTag(content, pos, endPos);
		if (nextTag.type == Tag::Null) {
			return nextTag;
		} else if (nextTag.type == Tag::SectionStart || nextTag.type == Tag::InvertedSectionStart) {
			++tagDepth;
		} else if (nextTag.type == Tag::SectionEnd) {
			--tagDepth;
			if (tagDepth == 0) {
				if (nextTag.key != startTag.key) {
					setError("Tag start/end key mismatch", nextTag.start);
					return Tag();
				}
				return nextTag;
			}
		}
		pos = nextTag.end;
	}

	return Tag();
}